

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

void * ggml_backend_cpu_get_proc_address(ggml_backend_reg_t reg,char *name)

{
  int iVar1;
  char *in_RSI;
  ggml_backend_dev_get_extra_bufts_t fct_1;
  ggml_backend_set_n_threads_t fct;
  code *local_8;
  
  iVar1 = strcmp(in_RSI,"ggml_backend_set_n_threads");
  if (iVar1 == 0) {
    local_8 = ggml_backend_cpu_set_n_threads;
  }
  else {
    iVar1 = strcmp(in_RSI,"ggml_backend_dev_get_extra_bufts");
    if (iVar1 == 0) {
      local_8 = ggml_backend_cpu_device_get_extra_buffers_type;
    }
    else {
      iVar1 = strcmp(in_RSI,"ggml_backend_get_features");
      if (iVar1 == 0) {
        local_8 = ggml_backend_cpu_get_features;
      }
      else {
        iVar1 = strcmp(in_RSI,"ggml_backend_set_abort_callback");
        if (iVar1 == 0) {
          local_8 = ggml_backend_cpu_set_abort_callback;
        }
        else {
          iVar1 = strcmp(in_RSI,"ggml_backend_cpu_numa_init");
          if (iVar1 == 0) {
            local_8 = ggml_numa_init;
          }
          else {
            iVar1 = strcmp(in_RSI,"ggml_backend_cpu_is_numa");
            if (iVar1 == 0) {
              local_8 = ggml_is_numa;
            }
            else {
              iVar1 = strcmp(in_RSI,"ggml_threadpool_new");
              if (iVar1 == 0) {
                local_8 = ggml_threadpool_new;
              }
              else {
                iVar1 = strcmp(in_RSI,"ggml_threadpool_free");
                if (iVar1 == 0) {
                  local_8 = ggml_threadpool_free;
                }
                else {
                  iVar1 = strcmp(in_RSI,"ggml_backend_cpu_set_threadpool");
                  if (iVar1 == 0) {
                    local_8 = ggml_backend_cpu_set_threadpool;
                  }
                  else {
                    local_8 = (code *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

static void * ggml_backend_cpu_get_proc_address(ggml_backend_reg_t reg, const char * name) {
    if (strcmp(name, "ggml_backend_set_n_threads") == 0) {
        ggml_backend_set_n_threads_t fct = ggml_backend_cpu_set_n_threads;
        return (void *)fct;
    }
    if (strcmp(name, "ggml_backend_dev_get_extra_bufts") == 0) {
        ggml_backend_dev_get_extra_bufts_t fct = ggml_backend_cpu_device_get_extra_buffers_type;
        return (void *)fct;
    }
    if (strcmp(name, "ggml_backend_get_features") == 0) {
        return (void *)ggml_backend_cpu_get_features;
    }
    if (strcmp(name, "ggml_backend_set_abort_callback") == 0) {
        return (void *)ggml_backend_cpu_set_abort_callback;
    }
    if (strcmp(name, "ggml_backend_cpu_numa_init") == 0) {
        return (void *)ggml_numa_init;
    }
    if (strcmp(name, "ggml_backend_cpu_is_numa") == 0) {
        return (void *)ggml_is_numa;
    }

    // threadpool - TODO:  move to ggml-base
    if (strcmp(name, "ggml_threadpool_new") == 0) {
        return (void *)ggml_threadpool_new;
    }
    if (strcmp(name, "ggml_threadpool_free") == 0) {
        return (void *)ggml_threadpool_free;
    }
    if (strcmp(name, "ggml_backend_cpu_set_threadpool") == 0) {
        return (void *)ggml_backend_cpu_set_threadpool;
    }

    return NULL;

    GGML_UNUSED(reg);
}